

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_context.cpp
# Opt level: O0

bool __thiscall spvtools::opt::IRContext::RemoveExtension(IRContext *this,Extension extension)

{
  bool bVar1;
  char *__str;
  pointer this_00;
  anon_class_8_1_542b318a local_68;
  function<bool_(spvtools::opt::Instruction_*)> local_60;
  undefined1 local_40 [8];
  undefined1 local_38 [23];
  bool removed;
  string_view extensionName;
  Extension extension_local;
  IRContext *this_local;
  
  extensionName._M_str._4_4_ = extension;
  __str = ExtensionToString(extension);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)(local_38 + 0x10),__str);
  module(this);
  Module::extension_begin((Module *)local_38);
  module(this);
  Module::extension_end((Module *)local_40);
  local_68.extensionName = (string_view *)(local_38 + 0x10);
  std::function<bool(spvtools::opt::Instruction*)>::
  function<spvtools::opt::IRContext::RemoveExtension(spvtools::Extension)::__0,void>
            ((function<bool(spvtools::opt::Instruction*)> *)&local_60,&local_68);
  bVar1 = KillInstructionIf(this,(inst_iterator *)local_38,(inst_iterator *)local_40,&local_60);
  std::function<bool_(spvtools::opt::Instruction_*)>::~function(&local_60);
  local_38[0xf] = bVar1;
  if ((bVar1) && (bVar1 = std::operator!=(&this->feature_mgr_,(nullptr_t)0x0), bVar1)) {
    this_00 = std::
              unique_ptr<spvtools::opt::FeatureManager,_std::default_delete<spvtools::opt::FeatureManager>_>
              ::operator->(&this->feature_mgr_);
    FeatureManager::RemoveExtension(this_00,extensionName._M_str._4_4_);
  }
  return (bool)(local_38[0xf] & 1);
}

Assistant:

bool IRContext::RemoveExtension(Extension extension) {
  const std::string_view extensionName = ExtensionToString(extension);
  const bool removed = KillInstructionIf(
      module()->extension_begin(), module()->extension_end(),
      [&extensionName](Instruction* inst) {
        return inst->GetOperand(0).AsString() == extensionName;
      });

  if (removed && feature_mgr_ != nullptr) {
    feature_mgr_->RemoveExtension(extension);
  }

  return removed;
}